

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxread.c
# Opt level: O2

WebPMux * WebPMuxCreateInternal(WebPData *bitstream,int copy_data,int version)

{
  ulong riff_size;
  WebPChunk **chunk_list;
  uint32_t uVar1;
  int *piVar2;
  WebPMuxError WVar3;
  uint uVar4;
  WebPChunkId WVar5;
  int iVar6;
  int iVar7;
  WebPMux *mux;
  WebPMuxImage *wpi;
  WebPChunk **chunk_list_00;
  uint8_t *puVar8;
  ulong uVar9;
  ulong uVar10;
  WebPChunk **ppWVar11;
  long lVar12;
  uint8_t *puVar13;
  int *data;
  ulong uVar14;
  WebPChunk ***chunk_list_01;
  ulong uVar15;
  size_t data_size;
  WebPChunk chunk;
  WebPChunk subchunk;
  WebPChunk **unknown_chunk_list;
  WebPData local_98;
  WebPChunk **chunk_list_ends [11];
  
  chunk_list_ends[8] = (WebPChunk **)0x0;
  chunk_list_ends[9] = (WebPChunk **)0x0;
  chunk_list_ends[6] = (WebPChunk **)0x0;
  chunk_list_ends[7] = (WebPChunk **)0x0;
  chunk_list_ends[4] = (WebPChunk **)0x0;
  chunk_list_ends[5] = (WebPChunk **)0x0;
  chunk_list_ends[2] = (WebPChunk **)0x0;
  chunk_list_ends[3] = (WebPChunk **)0x0;
  chunk_list_ends[0] = (WebPChunk **)0x0;
  chunk_list_ends[1] = (WebPChunk **)0x0;
  chunk_list_ends[10] = (WebPChunk **)0x0;
  ChunkInit(&chunk);
  if (bitstream == (WebPData *)0x0 || (version & 0xffffff00U) != 0x100) {
    return (WebPMux *)0x0;
  }
  piVar2 = (int *)bitstream->bytes;
  uVar14 = bitstream->size;
  if (uVar14 < 0x14 || piVar2 == (int *)0x0) {
    return (WebPMux *)0x0;
  }
  if (*piVar2 != 0x46464952) {
    return (WebPMux *)0x0;
  }
  if (piVar2[2] != 0x50424557) {
    return (WebPMux *)0x0;
  }
  mux = WebPNewInternal(0x108);
  if (mux == (WebPMux *)0x0) {
    return (WebPMux *)0x0;
  }
  uVar1 = piVar2[3];
  if ((((uVar1 == 0x20385056) || (uVar1 == 0x4c385056)) || (uVar1 == 0x58385056)) &&
     ((uint)piVar2[1] < 0xfffffff7)) {
    uVar15 = (ulong)(piVar2[1] + 1U & 0xfffffffe);
    riff_size = uVar15 + 8;
    if (riff_size <= uVar14) {
      uVar15 = uVar15 + 0x10;
      if (uVar14 < uVar15) {
        uVar15 = uVar14;
      }
      wpi = (WebPMuxImage *)WebPSafeMalloc(1,0x38);
      if (wpi != (WebPMuxImage *)0x0) {
        data_size = uVar15 - 0xc;
        MuxImageInit(wpi);
        chunk_list = &wpi->img_;
        chunk_list_00 = &wpi->alpha_;
        for (data = piVar2 + 3; data != (int *)((long)piVar2 + uVar15);
            data = (int *)((long)data + lVar12)) {
          WVar3 = ChunkVerifyAndAssign(&chunk,(uint8_t *)data,data_size,riff_size,copy_data);
          if (WVar3 != WEBP_MUX_OK) goto LAB_00106375;
          uVar4 = (int)chunk.data_.size + 1U & 0xfffffffe;
          WVar5 = ChunkGetIdFromTag(chunk.tag_);
          puVar13 = chunk.data_.bytes;
          if (WVar5 == WEBP_CHUNK_ANMF) {
            if (wpi->is_partial_ == 0) {
              uVar14 = CONCAT44(chunk.data_.size._4_4_,(int)chunk.data_.size);
              puVar8 = chunk.data_.bytes + uVar14;
              if (chunk.data_.bytes == (uint8_t *)0x0) {
                puVar8 = (uint8_t *)0x0;
              }
              unknown_chunk_list = &wpi->unknown_;
              ChunkInit(&subchunk);
              local_98.bytes = puVar13;
              local_98.size = 0x10;
              if (0xf < uVar14) {
                ChunkAssignData(&subchunk,&local_98,copy_data,chunk.tag_);
                ChunkSetHead(&subchunk,(WebPChunk **)wpi);
                wpi->is_partial_ = 1;
                uVar10 = (ulong)((int)subchunk.data_.size + 1U & 0xfffffffe);
                for (puVar13 = puVar13 + uVar10; uVar14 = uVar14 - uVar10, puVar13 != puVar8;
                    puVar13 = puVar13 + uVar9 + 8) {
                  ChunkInit(&subchunk);
                  WVar3 = ChunkVerifyAndAssign(&subchunk,puVar13,uVar14,uVar14,copy_data);
                  if (WVar3 != WEBP_MUX_OK) goto LAB_001063a6;
                  WVar5 = ChunkGetIdFromTag(subchunk.tag_);
                  if (WVar5 == WEBP_CHUNK_UNKNOWN) {
                    if ((wpi->is_partial_ != 0) ||
                       (WVar3 = ChunkAppend(&subchunk,&unknown_chunk_list), WVar3 != WEBP_MUX_OK))
                    goto LAB_001063a6;
                  }
                  else {
                    if (WVar5 == WEBP_CHUNK_IMAGE) {
                      if ((*chunk_list != (WebPChunk *)0x0) ||
                         (WVar3 = ChunkSetHead(&subchunk,chunk_list), WVar3 != WEBP_MUX_OK))
                      goto LAB_001063a6;
                      iVar7 = MuxImageFinalize(wpi);
                      iVar6 = 0;
                      if (iVar7 == 0) goto LAB_001063a6;
                    }
                    else {
                      if ((WVar5 != WEBP_CHUNK_ALPHA) || (*chunk_list_00 != (WebPChunk *)0x0))
                      goto LAB_001063a6;
                      WVar3 = ChunkSetHead(&subchunk,chunk_list_00);
                      iVar6 = 1;
                      if (WVar3 != WEBP_MUX_OK) goto LAB_001063a6;
                    }
                    wpi->is_partial_ = iVar6;
                  }
                  uVar9 = (ulong)((int)subchunk.data_.size + 1U & 0xfffffffe);
                  uVar10 = uVar9 + 8;
                }
                if (wpi->is_partial_ == 0) {
                  ChunkRelease(&chunk);
                  goto LAB_001060d1;
                }
              }
LAB_001063a6:
              ChunkRelease(&subchunk);
            }
            goto LAB_00106375;
          }
          if (WVar5 == WEBP_CHUNK_IMAGE) {
            WVar3 = ChunkSetHead(&chunk,chunk_list);
            if ((WVar3 != WEBP_MUX_OK) || (iVar6 = MuxImageFinalize(wpi), iVar6 == 0))
            goto LAB_00106375;
            wpi->is_partial_ = 0;
LAB_001060d1:
            WVar3 = MuxImagePush(wpi,&mux->images_);
            if (WVar3 != WEBP_MUX_OK) goto LAB_00106375;
            MuxImageInit(wpi);
          }
          else if (WVar5 == WEBP_CHUNK_ALPHA) {
            if ((*chunk_list_00 != (WebPChunk *)0x0) ||
               (WVar3 = ChunkSetHead(&chunk,chunk_list_00), WVar3 != WEBP_MUX_OK))
            goto LAB_00106375;
            wpi->is_partial_ = 1;
          }
          else {
            if (wpi->is_partial_ != 0) goto LAB_00106375;
            chunk_list_01 = chunk_list_ends + WVar5;
            if (*chunk_list_01 == (WebPChunk **)0x0) {
              ppWVar11 = MuxGetChunkListFromId(mux,WVar5);
              *chunk_list_01 = ppWVar11;
            }
            WVar3 = ChunkAppend(&chunk,chunk_list_01);
            if (WVar3 != WEBP_MUX_OK) goto LAB_00106375;
            if (WVar5 == WEBP_CHUNK_VP8X) {
              if (uVar4 < 10) goto LAB_00106375;
              mux->canvas_width_ =
                   (uint)*(ushort *)(data + 3) + (uint)*(byte *)((long)data + 0xe) * 0x10000 + 1;
              mux->canvas_height_ =
                   (uint)*(ushort *)((long)data + 0xf) +
                   (uint)*(byte *)((long)data + 0x11) * 0x10000 + 1;
            }
          }
          lVar12 = (ulong)uVar4 + 8;
          data_size = data_size - lVar12;
          ChunkInit(&chunk);
        }
        if ((wpi->is_partial_ == 0) && (WVar3 = MuxValidate(mux), WVar3 == WEBP_MUX_OK)) {
          MuxImageDelete(wpi);
          return mux;
        }
        goto LAB_00106375;
      }
    }
  }
  wpi = (WebPMuxImage *)0x0;
LAB_00106375:
  ChunkRelease(&chunk);
  MuxImageDelete(wpi);
  WebPMuxDelete(mux);
  return (WebPMux *)0x0;
}

Assistant:

WebPMux* WebPMuxCreateInternal(const WebPData* bitstream, int copy_data,
                               int version) {
  size_t riff_size;
  uint32_t tag;
  const uint8_t* end;
  WebPMux* mux = NULL;
  WebPMuxImage* wpi = NULL;
  const uint8_t* data;
  size_t size;
  WebPChunk chunk;
  // Stores the end of the chunk lists so that it is faster to append data to
  // their ends.
  WebPChunk** chunk_list_ends[WEBP_CHUNK_NIL + 1] = { NULL };
  ChunkInit(&chunk);

  if (WEBP_ABI_IS_INCOMPATIBLE(version, WEBP_MUX_ABI_VERSION)) {
    return NULL;  // version mismatch
  }
  if (bitstream == NULL) return NULL;

  data = bitstream->bytes;
  size = bitstream->size;

  if (data == NULL) return NULL;
  if (size < RIFF_HEADER_SIZE + CHUNK_HEADER_SIZE) return NULL;
  if (GetLE32(data + 0) != MKFOURCC('R', 'I', 'F', 'F') ||
      GetLE32(data + CHUNK_HEADER_SIZE) != MKFOURCC('W', 'E', 'B', 'P')) {
    return NULL;
  }

  mux = WebPMuxNew();
  if (mux == NULL) return NULL;

  tag = GetLE32(data + RIFF_HEADER_SIZE);
  if (tag != kChunks[IDX_VP8].tag &&
      tag != kChunks[IDX_VP8L].tag &&
      tag != kChunks[IDX_VP8X].tag) {
    goto Err;  // First chunk should be VP8, VP8L or VP8X.
  }

  riff_size = GetLE32(data + TAG_SIZE);
  if (riff_size > MAX_CHUNK_PAYLOAD) goto Err;

  // Note this padding is historical and differs from demux.c which does not
  // pad the file size.
  riff_size = SizeWithPadding(riff_size);
  if (riff_size < CHUNK_HEADER_SIZE) goto Err;
  if (riff_size > size) goto Err;
  // There's no point in reading past the end of the RIFF chunk.
  if (size > riff_size + CHUNK_HEADER_SIZE) {
    size = riff_size + CHUNK_HEADER_SIZE;
  }

  end = data + size;
  data += RIFF_HEADER_SIZE;
  size -= RIFF_HEADER_SIZE;

  wpi = (WebPMuxImage*)WebPSafeMalloc(1ULL, sizeof(*wpi));
  if (wpi == NULL) goto Err;
  MuxImageInit(wpi);

  // Loop over chunks.
  while (data != end) {
    size_t data_size;
    WebPChunkId id;
    if (ChunkVerifyAndAssign(&chunk, data, size, riff_size,
                             copy_data) != WEBP_MUX_OK) {
      goto Err;
    }
    data_size = ChunkDiskSize(&chunk);
    id = ChunkGetIdFromTag(chunk.tag_);
    switch (id) {
      case WEBP_CHUNK_ALPHA:
        if (wpi->alpha_ != NULL) goto Err;  // Consecutive ALPH chunks.
        if (ChunkSetHead(&chunk, &wpi->alpha_) != WEBP_MUX_OK) goto Err;
        wpi->is_partial_ = 1;  // Waiting for a VP8 chunk.
        break;
      case WEBP_CHUNK_IMAGE:
        if (ChunkSetHead(&chunk, &wpi->img_) != WEBP_MUX_OK) goto Err;
        if (!MuxImageFinalize(wpi)) goto Err;
        wpi->is_partial_ = 0;  // wpi is completely filled.
 PushImage:
        // Add this to mux->images_ list.
        if (MuxImagePush(wpi, &mux->images_) != WEBP_MUX_OK) goto Err;
        MuxImageInit(wpi);  // Reset for reading next image.
        break;
      case WEBP_CHUNK_ANMF:
        if (wpi->is_partial_) goto Err;  // Previous wpi is still incomplete.
        if (!MuxImageParse(&chunk, copy_data, wpi)) goto Err;
        ChunkRelease(&chunk);
        goto PushImage;
      default:  // A non-image chunk.
        if (wpi->is_partial_) goto Err;  // Encountered a non-image chunk before
                                         // getting all chunks of an image.
        if (chunk_list_ends[id] == NULL) {
          chunk_list_ends[id] =
              MuxGetChunkListFromId(mux, id);  // List to add this chunk.
        }
        if (ChunkAppend(&chunk, &chunk_list_ends[id]) != WEBP_MUX_OK) goto Err;
        if (id == WEBP_CHUNK_VP8X) {  // grab global specs
          if (data_size < CHUNK_HEADER_SIZE + VP8X_CHUNK_SIZE) goto Err;
          mux->canvas_width_ = GetLE24(data + 12) + 1;
          mux->canvas_height_ = GetLE24(data + 15) + 1;
        }
        break;
    }
    data += data_size;
    size -= data_size;
    ChunkInit(&chunk);
  }

  // Incomplete image.
  if (wpi->is_partial_) goto Err;

  // Validate mux if complete.
  if (MuxValidate(mux) != WEBP_MUX_OK) goto Err;

  MuxImageDelete(wpi);
  return mux;  // All OK;

 Err:  // Something bad happened.
  ChunkRelease(&chunk);
  MuxImageDelete(wpi);
  WebPMuxDelete(mux);
  return NULL;
}